

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  reference ppSVar2;
  cmFileLockResult cVar3;
  __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
  local_40;
  __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
  local_38;
  It i_1;
  __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
  local_28;
  It i;
  string *filename_local;
  cmFileLockPool *this_local;
  cmFileLockResult result;
  
  i._M_current = (ScopePool **)filename;
  local_28._M_current =
       (ScopePool **)
       std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::begin
                 (&this->FunctionScopes);
  while( true ) {
    i_1._M_current =
         (ScopePool **)
         std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::end
                   (&this->FunctionScopes);
    bVar1 = __gnu_cxx::operator!=(&local_28,&i_1);
    if (!bVar1) {
      local_38._M_current =
           (ScopePool **)
           std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
           begin(&this->FileScopes);
      while( true ) {
        local_40._M_current =
             (ScopePool **)
             std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ::end(&this->FileScopes);
        bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
        if (!bVar1) {
          cVar3 = ScopePool::Release(&this->ProcessScope,(string *)i._M_current);
          return cVar3;
        }
        ppSVar2 = __gnu_cxx::
                  __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
                  ::operator*(&local_38);
        this_local = (cmFileLockPool *)ScopePool::Release(*ppSVar2,(string *)i._M_current);
        bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
        ::operator++(&local_38);
      }
      return (cmFileLockResult)this_local;
    }
    ppSVar2 = __gnu_cxx::
              __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
              ::operator*(&local_28);
    this_local = (cmFileLockPool *)ScopePool::Release(*ppSVar2,(string *)i._M_current);
    bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFileLockPool::ScopePool_**,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
    ::operator++(&local_28);
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (It i = this->FunctionScopes.begin(); i != this->FunctionScopes.end();
       ++i) {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (It i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i) {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}